

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

Iterator * __thiscall
kj::_::BTreeImpl::insert(Iterator *__return_storage_ptr__,BTreeImpl *this,SearchKey *searchKey)

{
  NodeUnion *tree;
  bool bVar1;
  uint row;
  Leaf *leaf_00;
  BTreeImpl *pBVar2;
  AllocResult<kj::_::BTreeImpl::Parent> AVar3;
  StringPtr end;
  Leaf *leaf;
  Parent *node;
  Iterator local_68;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_int> *__range2;
  Parent *pPStack_48;
  uint indexInParent;
  Parent *parent;
  uint pos;
  Fault local_30;
  Fault f;
  SearchKey *searchKey_local;
  BTreeImpl *this_local;
  
  pBVar2 = this;
  if ((this->freelistSize < this->height + 2) &&
     (((this->height == 0 || (bVar1 = Parent::isFull((Parent *)this->tree), bVar1)) ||
      (this->freelistSize < this->height)))) {
    pBVar2 = (BTreeImpl *)0x0;
    growTree(this,0);
    if (this->freelistHead == 0) {
      AVar3 = alloc<kj::_::BTreeImpl::Parent>(this);
      f.exception._0_4_ = AVar3.index;
      if ((uint)f.exception != 0) {
        Debug::Fault::Fault(&local_30,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0x189,FAILED,"alloc<Parent>().index == 0","");
        Debug::Fault::fatal(&local_30);
      }
      f.exception._0_4_ = 0;
    }
  }
  parent._0_4_ = 0;
  pPStack_48 = (Parent *)0x0;
  __range2._4_4_ = 0;
  end.content.ptr = (char *)(ulong)this->height;
  end.content.size_ = (size_t)pBVar2;
  ___end2 = zeroTo<unsigned_int>(end);
  i = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end2);
  local_68 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end2);
  while (bVar1 = Range<unsigned_int>::Iterator::operator!=((Iterator *)&i,&local_68), bVar1) {
    Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
    pPStack_48 = insertHelper<kj::_::BTreeImpl::Parent>
                           (this,searchKey,(Parent *)(this->tree + (uint)parent),pPStack_48,
                            __range2._4_4_,(uint)parent);
    __range2._4_4_ = (**searchKey->_vptr_SearchKey)(searchKey,pPStack_48);
    parent._0_4_ = pPStack_48->children[__range2._4_4_];
    Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
  }
  leaf_00 = insertHelper<kj::_::BTreeImpl::Leaf>
                      (this,searchKey,(Leaf *)(this->tree + (uint)parent),pPStack_48,__range2._4_4_,
                       (uint)parent);
  tree = this->tree;
  row = (*searchKey->_vptr_SearchKey[1])(searchKey,leaf_00);
  Iterator::Iterator(__return_storage_ptr__,tree,leaf_00,row);
  return __return_storage_ptr__;
}

Assistant:

BTreeImpl::Iterator BTreeImpl::insert(const SearchKey& searchKey) {
  // Like search() but ensures that there is room in the leaf node to insert a new row.

  // If we split the root node it will generate two new nodes. If we split any other node in the
  // path it will generate one new node. `height` doesn't count leaf nodes, but we can equivalently
  // think of it as not counting the root node, so in the worst case we may allocate height + 2
  // new nodes.
  //
  // (Also note that if the tree is currently empty, then `tree` points to a dummy root node in
  // read-only memory. We definitely need to allocate a real tree node array in this case, and
  // we'll start out allocating space for four nodes, which will be all we need up to 28 rows.)
  if (freelistSize < height + 2) {
    if (height > 0 && !tree[0].parent.isFull() && freelistSize >= height) {
      // Slight optimization: The root node is not full, so we're definitely not going to split it.
      // That means that the maximum allocations we might do is equal to `height`, not
      // `height + 2`, and we have that much space, so no need to grow yet.
      //
      // This optimization is particularly important for small trees, e.g. when treeCapacity is 4
      // and the tree so far consists of a root and two children, we definitely don't need to grow
      // the tree yet.
    } else {
      growTree();

      if (freelistHead == 0) {
        // We have no root yet. Allocate one.
        KJ_ASSERT(alloc<Parent>().index == 0);
      }
    }
  }

  uint pos = 0;

  // Track grandparent node and child index within grandparent.
  Parent* parent = nullptr;
  uint indexInParent = 0;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    Parent& node = insertHelper(searchKey, tree[pos].parent, parent, indexInParent, pos);

    parent = &node;
    indexInParent = searchKey.search(node);
    pos = node.children[indexInParent];
  }

  Leaf& leaf = insertHelper(searchKey, tree[pos].leaf, parent, indexInParent, pos);

  // Fun fact: Unlike erase(), there's no need to climb back up the tree modifying keys, because
  // either the newly-inserted node will not be the last in the leaf (and thus parent keys aren't
  // modified), or the leaf is the last leaf in the tree (and thus there's no parent key to
  // modify).

  return { tree, &leaf, searchKey.search(leaf) };
}